

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<double> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  int iVar3;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  byte *pbVar8;
  wchar_t wVar9;
  uint uVar10;
  wchar_t wVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  bool pointy;
  int significand_size;
  wchar_t decimal_point;
  sign_t sign;
  wchar_t zero;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_40_8_c3c31ef8 write;
  wchar_t local_d8;
  wchar_t local_d4;
  undefined1 local_d0 [12];
  undefined1 local_c4 [8];
  wchar_t local_bc;
  float_specs local_b8;
  undefined1 local_ac [8];
  int iStack_a4;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int local_88;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_80;
  anon_class_72_9_d68ba176 local_78;
  
  local_b8 = (float_specs)fp->significand;
  lVar6 = 0x3f;
  if (((ulong)local_b8 | 1) != 0) {
    for (; ((ulong)local_b8 | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  local_d4 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] -
             (uint)((ulong)local_b8 <
                   (ulong)*(float_specs *)
                           (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar6] * 8));
  local_bc = 0x30;
  local_d0._4_4_ = fspecs._4_4_;
  local_c4._4_4_ = (uint)local_d0._4_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if (local_d4 < L'\0') goto LAB_00177c27;
  uVar14 = (local_d4 + L'\x01') - (uint)(local_c4._4_4_ == 0);
  uVar12 = (ulong)uVar14;
  local_c4._0_4_ = L'.';
  uVar10 = (uint)local_d0._4_4_ >> 0x11;
  local_d0._0_8_ = fspecs;
  if ((uVar10 & 1) != 0) {
    local_c4._0_4_ = fmt::v8::detail::decimal_point_impl<wchar_t>(loc);
  }
  iVar3 = fp->exponent;
  local_ac._0_4_ = local_d4 + iVar3;
  if (SUB81(local_d0._0_8_,4) == '\x01') {
LAB_00177988:
    iVar3 = local_d4 + iVar3 + -1;
    if (((uint)local_d0._4_4_ >> 0x14 & 1) == 0) {
      iVar7 = 0;
      if (local_d4 == L'\x01') {
        local_c4._0_4_ = L'\0';
        iVar7 = 0;
      }
    }
    else {
      iVar7 = 0;
      if (0 < local_d0._0_4_ - local_d4) {
        iVar7 = local_d0._0_4_ - local_d4;
      }
      uVar12 = (ulong)(uVar14 + iVar7);
    }
    local_78.sign = (sign_t *)CONCAT44(local_78.sign._4_4_,local_c4._4_4_);
    local_78.significand = (significand_type *)local_b8;
    local_78.significand_size = (int *)CONCAT44(local_c4._0_4_,local_d4);
    local_78.fp = (decimal_fp<double> *)CONCAT44(0x30,iVar7);
    local_78.grouping =
         (digit_grouping<wchar_t> *)
         (CONCAT44(iVar3,(int)CONCAT71(local_78.grouping._1_7_,
                                       (((uint)local_d0._4_4_ >> 0x10 & 1) == 0) << 5)) | 0x45);
    if (specs->width < 1) {
      bVar4 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<double>,_wchar_t,_fmt::v8::detail::digit_grouping<wchar_t>_>
              ::anon_class_40_8_c3c31ef8::operator()
                        ((anon_class_40_8_c3c31ef8 *)&local_78,out.container);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar3 = 1 - local_ac._0_4_;
      }
      lVar6 = 2;
      if (99 < iVar3) {
        lVar6 = (ulong)(999 < iVar3) + 3;
      }
      sVar13 = uVar12 + lVar6 + (3 - (ulong)(local_c4._0_4_ == L'\0'));
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                        (out,specs,sVar13,sVar13,(anon_class_40_8_c3c31ef8 *)&local_78);
    }
  }
  else {
    if ((local_d0._0_8_ & 0xff00000000) == 0) {
      iVar7 = 0x10;
      if (0 < (int)local_d0._0_4_) {
        iVar7 = local_d0._0_4_;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar7 < (int)local_ac._0_4_)) goto LAB_00177988;
    }
    if (iVar3 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar3 = -local_ac._0_4_;
        local_ac._4_4_ = iVar3;
        if (SBORROW4(local_d0._0_4_,iVar3) != (int)(local_d0._0_4_ + local_ac._0_4_) < 0) {
          local_ac._4_4_ = local_d0._0_4_;
        }
        if ((int)local_d0._0_4_ < 0) {
          local_ac._4_4_ = iVar3;
        }
        if (local_d4 != L'\0') {
          local_ac._4_4_ = iVar3;
        }
        bVar2 = 1;
        if (local_d4 == L'\0' && local_ac._4_4_ == 0) {
          bVar2 = (local_d0[6] & 0x10) >> 4;
        }
        local_d8 = CONCAT31(local_d8._1_3_,bVar2);
        fVar1 = (float_specs)local_d0._0_8_;
        if (-1 < (int)local_ac._4_4_) {
          sVar13 = ((uint)bVar2 + local_ac._4_4_ + 1) + uVar12;
          local_78.sign = (sign_t *)(local_c4 + 4);
          local_78.significand = (significand_type *)&local_bc;
          local_78.fp = (decimal_fp<double> *)(local_d0 + 0xc);
          local_78.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
          local_78.fspecs = &local_b8;
          local_78.decimal_point = &local_d4;
          local_78.significand_size = &local_d8;
          bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)&local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
        }
LAB_00177c27:
        local_d0._0_8_ = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      wVar11 = L'\0';
      local_d8 = local_d0._0_4_ - local_d4 & (int)(local_d0._4_4_ << 0xb) >> 0x1f;
      wVar9 = local_d8;
      if (local_d8 < L'\x01') {
        wVar9 = wVar11;
      }
      local_80.container = out.container;
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar8 = pbVar5 + local_a0;
      sVar13 = (uint)wVar9 + uVar12;
      do {
        wVar9 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar5 == pbVar8) {
            uVar10 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar2 = *pbVar5;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00177afe;
            pbVar5 = pbVar5 + 1;
            uVar10 = (uint)bVar2;
          }
          wVar11 = wVar11 + uVar10;
          wVar9 = wVar11;
        }
LAB_00177afe:
        sVar13 = sVar13 + 1;
      } while (wVar9 < local_d4);
      local_78.sign = (sign_t *)(local_c4 + 4);
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = &local_d4;
      local_78.fp = (decimal_fp<double> *)local_ac;
      local_78.grouping = (digit_grouping<wchar_t> *)(local_d0 + 0xc);
      local_78.num_zeros = &local_bc;
      local_78.fspecs = (float_specs *)(local_ac + 4);
      local_78.decimal_point = &local_d8;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_&>
                        (local_80,specs,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)&local_78);
    }
    else {
      uVar12 = (ulong)(iVar3 + uVar14);
      local_d8 = local_d0._0_4_ - local_ac._0_4_;
      if (((uint)local_d0._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_d0._0_8_,4) != '\x02' && local_d8 < L'\x01') {
          local_d8 = L'\x01';
        }
        if (L'\0' < local_d8) {
          uVar12 = uVar12 + (uint)local_d8 + 1;
        }
      }
      digit_grouping<wchar_t>::digit_grouping
                ((digit_grouping<wchar_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_d0._4_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(iStack_a4,local_ac._4_4_);
      pbVar8 = pbVar5 + local_a0;
      sVar13 = uVar12 - 1;
      wVar9 = L'\0';
      do {
        wVar11 = L'\x7fffffff';
        if (local_88 != 0) {
          if (pbVar5 == pbVar8) {
            uVar10 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar2 = *pbVar5;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00177921;
            pbVar5 = pbVar5 + 1;
            uVar10 = (uint)bVar2;
          }
          wVar9 = wVar9 + uVar10;
          wVar11 = wVar9;
        }
LAB_00177921:
        sVar13 = sVar13 + 1;
      } while (wVar11 < local_d4);
      local_78.sign = (sign_t *)(local_c4 + 4);
      local_78.significand = (significand_type *)&local_b8;
      local_78.significand_size = &local_d4;
      local_78.fspecs = (float_specs *)local_d0;
      local_78.decimal_point = (wchar_t *)(local_d0 + 0xc);
      local_78.zero = &local_bc;
      local_78.fp = fp;
      local_78.grouping = (digit_grouping<wchar_t> *)(local_ac + 4);
      local_78.num_zeros = &local_d8;
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_&>
                        (out,specs,sVar13,sVar13,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(iStack_a4,local_ac._4_4_) != &local_98) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(iStack_a4,local_ac._4_4_),local_98._M_allocated_capacity + 1);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}